

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsBase.cpp
# Opt level: O0

string * __thiscall
vkt::sparse::getOpTypeImageResidency_abi_cxx11_
          (string *__return_storage_ptr__,sparse *this,ImageType imageType)

{
  ostringstream local_190 [8];
  ostringstream src;
  ImageType imageType_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"OpTypeImage %type_uint ");
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::operator<<((ostream *)local_190,"1D 0 0 0 2 R32ui");
    break;
  case 1:
    std::operator<<((ostream *)local_190,"1D 0 1 0 2 R32ui");
    break;
  case 2:
    std::operator<<((ostream *)local_190,"2D 0 0 0 2 R32ui");
    break;
  case 3:
    std::operator<<((ostream *)local_190,"2D 0 1 0 2 R32ui");
    break;
  case 4:
    std::operator<<((ostream *)local_190,"3D 0 0 0 2 R32ui");
    break;
  case 5:
    std::operator<<((ostream *)local_190,"Cube 0 0 0 2 R32ui");
    break;
  case 6:
    std::operator<<((ostream *)local_190,"Cube 0 1 0 2 R32ui");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string getOpTypeImageResidency (const ImageType imageType)
{
	std::ostringstream	src;

	src << "OpTypeImage %type_uint ";

	switch (imageType)
	{
		case IMAGE_TYPE_1D :
			src << "1D 0 0 0 2 R32ui";
		break;
		case IMAGE_TYPE_1D_ARRAY :
			src << "1D 0 1 0 2 R32ui";
		break;
		case IMAGE_TYPE_2D :
			src << "2D 0 0 0 2 R32ui";
		break;
		case IMAGE_TYPE_2D_ARRAY :
			src << "2D 0 1 0 2 R32ui";
		break;
		case IMAGE_TYPE_3D :
			src << "3D 0 0 0 2 R32ui";
		break;
		case IMAGE_TYPE_CUBE :
			src << "Cube 0 0 0 2 R32ui";
		break;
		case IMAGE_TYPE_CUBE_ARRAY :
			src << "Cube 0 1 0 2 R32ui";
		break;
		default :
			DE_ASSERT(0);
		break;
	};

	return src.str();
}